

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

void ghash_final(ghash_ctx *ctx,uint8_t *out)

{
  size_t sVar1;
  ulong uVar2;
  uint8_t lenbuf [8];
  ulong local_38;
  
  if (ctx->state - 1 < 2) {
    sVar1 = ctx->buffer_used;
    if (sVar1 != 0) {
      memset(ctx->buffer + sVar1,0,0x10 - sVar1);
      ghash_block(ctx,ctx->buffer);
      ctx->buffer_used = 0;
    }
    ctx->state = 0;
  }
  uVar2 = ctx->len_aad << 3;
  local_38 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | ctx->len_aad << 0x3b;
  cf_blockwise_accumulate(ctx->buffer,&ctx->buffer_used,0x10,&local_38,8,ghash_block,ctx);
  uVar2 = ctx->len_cipher << 3;
  local_38 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | ctx->len_cipher << 0x3b;
  cf_blockwise_accumulate(ctx->buffer,&ctx->buffer_used,0x10,&local_38,8,ghash_block,ctx);
  if (ctx->buffer_used == 0) {
    cf_gf128_tobytes_be(ctx->Y,out);
    return;
  }
  abort();
}

Assistant:

static void ghash_final(ghash_ctx *ctx, uint8_t out[16])
{
  uint8_t lenbuf[8];

  if (ctx->state == STATE_AAD || ctx->state == STATE_CIPHER)
  {
    ghash_add_pad(ctx);
    ctx->state = STATE_INVALID;
  }

  /* Add len(A) || len(C) */
  write64_be(ctx->len_aad * 8, lenbuf);
  ghash_add(ctx, lenbuf, sizeof lenbuf);

  write64_be(ctx->len_cipher * 8, lenbuf);
  ghash_add(ctx, lenbuf, sizeof lenbuf);

  assert(ctx->buffer_used == 0);
  cf_gf128_tobytes_be(ctx->Y, out);
}